

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# self_test_core.c
# Opt level: O0

OSSL_SELF_TEST * OSSL_SELF_TEST_new(OSSL_CALLBACK *cb,void *cbarg)

{
  char *in_RSI;
  OSSL_CALLBACK *in_RDI;
  OSSL_SELF_TEST *ret;
  OSSL_SELF_TEST *in_stack_000000a0;
  undefined8 in_stack_ffffffffffffffe0;
  OSSL_SELF_TEST *local_8;
  
  local_8 = (OSSL_SELF_TEST *)
            CRYPTO_zalloc((size_t)in_RDI,in_RSI,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (local_8 == (OSSL_SELF_TEST *)0x0) {
    local_8 = (OSSL_SELF_TEST *)0x0;
  }
  else {
    local_8->cb = in_RDI;
    local_8->cb_arg = in_RSI;
    local_8->phase = "";
    local_8->type = "";
    local_8->desc = "";
    self_test_setparams(in_stack_000000a0);
  }
  return local_8;
}

Assistant:

OSSL_SELF_TEST *OSSL_SELF_TEST_new(OSSL_CALLBACK *cb, void *cbarg)
{
    OSSL_SELF_TEST *ret = OPENSSL_zalloc(sizeof(*ret));

    if (ret == NULL)
        return NULL;

    ret->cb = cb;
    ret->cb_arg = cbarg;
    ret->phase = "";
    ret->type = "";
    ret->desc = "";
    self_test_setparams(ret);
    return ret;
}